

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O2

string * __thiscall
tinyusdz::print_layer_abi_cxx11_
          (string *__return_storage_ptr__,tinyusdz *this,Layer *layer,uint32_t indent)

{
  ostream *poVar1;
  iterator iVar2;
  uint32_t n;
  size_t i;
  ulong uVar3;
  PrimSpec *primspec;
  long lVar4;
  tinyusdz *ptVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
  primNameTable;
  token nameTok;
  stringstream ss;
  stringstream meta_ss;
  undefined1 local_3b0 [32];
  _Base_ptr local_390;
  size_t local_388;
  key_type local_380;
  string local_360;
  stringstream local_340 [16];
  ostream local_330 [376];
  undefined1 local_1b8 [392];
  
  uVar3 = (ulong)indent;
  primspec = (PrimSpec *)((ulong)layer & 0xffffffff);
  ::std::__cxx11::stringstream::stringstream(local_340);
  pprint::Indent_abi_cxx11_((string *)local_1b8,(pprint *)primspec,n);
  poVar1 = ::std::operator<<(local_330,(string *)local_1b8);
  ::std::operator<<(poVar1,"#usda 1.0\n");
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  print_layer_metas_abi_cxx11_
            ((string *)local_3b0,this + 0x58,(LayerMetas *)(ulong)((int)layer + 1),(uint32_t)uVar3);
  ::std::operator<<((ostream *)(local_1b8 + 0x10),(string *)local_3b0);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::stringbuf::str();
  lVar4 = CONCAT44(local_3b0._12_4_,local_3b0._8_4_);
  ::std::__cxx11::string::_M_dispose();
  if (lVar4 != 0) {
    ::std::operator<<(local_330,"(\n");
    ::std::__cxx11::stringbuf::str();
    ::std::operator<<(local_330,(string *)local_3b0);
    ::std::__cxx11::string::_M_dispose();
    ::std::operator<<(local_330,")\n");
  }
  ::std::operator<<(local_330,"\n");
  if (*(long *)(this + 0x1570) - *(long *)(this + 0x1568) >> 5 == *(long *)(this + 0x38)) {
    local_3b0._24_8_ = local_3b0 + 8;
    local_3b0._8_4_ = _S_red;
    local_3b0._16_8_ = 0;
    local_388 = 0;
    ptVar5 = this + 0x30;
    local_390 = (_Base_ptr)local_3b0._24_8_;
    while (ptVar5 = *(tinyusdz **)ptVar5, ptVar5 != (tinyusdz *)0x0) {
      local_380._M_dataplus._M_p = (pointer)(ptVar5 + 0x28);
      ::std::
      _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
      ::_M_emplace_unique<std::__cxx11::string_const&,tinyusdz::PrimSpec_const*>
                ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>,std::_Select1st<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,tinyusdz::PrimSpec_const*>>>
                  *)local_3b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(ptVar5 + 8),
                 (PrimSpec **)&local_380);
    }
    lVar4 = 0;
    for (uVar3 = 0; uVar3 < (ulong)(*(long *)(this + 0x1570) - *(long *)(this + 0x1568) >> 5);
        uVar3 = uVar3 + 1) {
      ::std::__cxx11::string::string
                ((string *)&local_380,(string *)(*(long *)(this + 0x1568) + lVar4));
      iVar2 = ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
              ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                      *)local_3b0,&local_380);
      if (iVar2._M_node != (_Base_ptr)(local_3b0 + 8)) {
        prim::print_primspec_abi_cxx11_
                  (&local_360,*(prim **)(iVar2._M_node + 2),primspec,
                   (uint32_t)(_Base_ptr)(local_3b0 + 8));
        ::std::operator<<(local_330,(string *)&local_360);
        ::std::__cxx11::string::_M_dispose();
        if (uVar3 != (*(long *)(this + 0x1570) - *(long *)(this + 0x1568) >> 5) - 1U) {
          ::std::operator<<(local_330,"\n");
        }
      }
      ::std::__cxx11::string::_M_dispose();
      lVar4 = lVar4 + 0x20;
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_tinyusdz::PrimSpec_*>_>_>
                 *)local_3b0);
  }
  else {
    ptVar5 = this + 0x30;
    while (ptVar5 = *(tinyusdz **)ptVar5, ptVar5 != (tinyusdz *)0x0) {
      prim::print_primspec_abi_cxx11_
                ((string *)local_3b0,(prim *)(ptVar5 + 0x28),primspec,(uint32_t)uVar3);
      ::std::operator<<(local_330,(string *)local_3b0);
      ::std::__cxx11::string::_M_dispose();
      if (*(long *)(this + 0x38) != 1) {
        ::std::operator<<(local_330,"\n");
      }
    }
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  ::std::__cxx11::stringstream::~stringstream(local_340);
  return __return_storage_ptr__;
}

Assistant:

std::string print_layer(const Layer &layer, const uint32_t indent) {
  std::stringstream ss;

  // FIXME: print magic-header outside of this function?
  ss << pprint::Indent(indent) << "#usda 1.0\n";

  std::stringstream meta_ss;
  meta_ss << print_layer_metas(layer.metas(), indent + 1);

  if (meta_ss.str().size()) {
    ss << "(\n";
    ss << meta_ss.str();
    ss << ")\n";
  }

  ss << "\n";

  if (layer.metas().primChildren.size() == layer.primspecs().size()) {
    std::map<std::string, const PrimSpec *> primNameTable;
    for (const auto &item : layer.primspecs()) {
      primNameTable.emplace(item.first, &item.second);
    }

    for (size_t i = 0; i < layer.metas().primChildren.size(); i++) {
      value::token nameTok = layer.metas().primChildren[i];
      // DCOUT(fmt::format("primChildren  {}/{} = {}", i,
      //                   layer.metas().primChildren.size(), nameTok.str()));
      const auto it = primNameTable.find(nameTok.str());
      if (it != primNameTable.end()) {
        ss << prim::print_primspec((*it->second), indent);
        if (i != (layer.metas().primChildren.size() - 1)) {
          ss << "\n";
        }
      } else {
        // TODO: Report warning?
      }
    }
  } else {
    size_t i = 0;
    for (const auto &item : layer.primspecs()) {
      ss << prim::print_primspec(item.second, indent);
      if (i != (layer.primspecs().size() - 1)) {
        ss << "\n";
      }
    }
  }

  return ss.str();
}